

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.cpp
# Opt level: O1

bool Kernel::MatchingUtils::haveReversedVariantArgs(Term *l1,Term *l2)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  DisagreementSetIterator *this;
  DisagreementSetIterator *pDVar7;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  *extraout_RDX;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  *extraout_RDX_00;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  *extraout_RDX_01;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  *i;
  undefined8 extraout_RDX_02;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
  *extraout_RDX_03;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
  *extraout_RDX_04;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
  *extraout_RDX_05;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
  *i_00;
  uint uVar8;
  TermList t2;
  TermList t1;
  bool bVar9;
  undefined1 auVar10 [16];
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> dsit;
  uint left;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
  it1;
  uint right;
  long *local_100;
  uint local_f8 [2];
  DisagreementSetIterator *local_f0;
  DisagreementSetIterator *local_e8;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *local_e0;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *local_d8;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
  local_d0;
  IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>
  local_b8;
  undefined1 local_a0;
  DisagreementSetIterator *local_98;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *local_90;
  undefined1 local_88;
  DisagreementSetIterator *local_80;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *local_78;
  undefined1 local_70;
  DisagreementSetIterator *local_68;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *local_60;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>_>
  local_58;
  
  if (haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::leftToRight == '\0') {
    haveReversedVariantArgs();
  }
  if (haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::rightToLeft == '\0') {
    haveReversedVariantArgs();
  }
  ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&haveReversedVariantArgs::leftToRight);
  ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&haveReversedVariantArgs::rightToLeft);
  t2._content = 2;
  if (((l1->_args[0]._content & 0x10) == 0) || (-1 < *(int *)&l1->field_0xc)) {
    bVar9 = false;
    t1._content = 2;
  }
  else {
    if (((l2->_args[0]._content & 0x10) == 0) || (-1 < *(int *)&l2->field_0xc)) {
      return false;
    }
    t1 = SortHelper::getEqualityArgumentSort((Literal *)l1);
    t2 = SortHelper::getEqualityArgumentSort((Literal *)l2);
    bVar9 = true;
  }
  this = (DisagreementSetIterator *)::operator_new(0x48);
  DisagreementSetIterator::DisagreementSetIterator
            (this,(TermList)l1->_args[*(uint *)&l1->field_0xc & 0xfffffff]._content,
             (TermList)l2->_args[(ulong)(*(uint *)&l2->field_0xc & 0xfffffff) - 1]._content,true);
  piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + 1;
  pDVar7 = (DisagreementSetIterator *)::operator_new(0x48);
  DisagreementSetIterator::DisagreementSetIterator
            (pDVar7,(TermList)l1->_args[(ulong)(*(uint *)&l1->field_0xc & 0xfffffff) - 1]._content,
             (TermList)l2->_args[*(uint *)&l2->field_0xc & 0xfffffff]._content,true);
  iVar5 = (pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + 1;
  (pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = iVar5 + 1;
  iVar5 = iVar5 + 4;
  (pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = iVar5;
  i = extraout_RDX;
  if (iVar5 == 0) {
    (*(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
      _vptr_IteratorCore[1])(pDVar7);
    i = extraout_RDX_00;
  }
  piVar1 = &(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
      _vptr_IteratorCore[1])(pDVar7);
    i = extraout_RDX_01;
  }
  local_f8[0] = CONCAT31(local_f8[0]._1_3_,1);
  piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + 1;
  piVar1 = &(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + 1;
  local_f0 = this;
  local_e8 = pDVar7;
  ::Lib::
  iterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>
            (&local_d0,(Lib *)local_f8,i);
  if (local_e8 != (DisagreementSetIterator *)0x0) {
    piVar1 = &(local_e8->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt
    ;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_e8->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
        _vptr_IteratorCore[1])();
    }
  }
  if (local_f0 != (DisagreementSetIterator *)0x0) {
    piVar1 = &(local_f0->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt
    ;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_f0->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
        _vptr_IteratorCore[1])();
    }
  }
  piVar1 = &(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
      _vptr_IteratorCore[1])(pDVar7);
  }
  piVar1 = &(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
      _vptr_IteratorCore[1])(pDVar7);
  }
  piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._vptr_IteratorCore
      [1])(this);
  }
  piVar1 = &(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
      _vptr_IteratorCore[1])(pDVar7);
  }
  piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._vptr_IteratorCore
      [1])(this);
  }
  if (bVar9) {
    this = (DisagreementSetIterator *)::operator_new(0x48);
    DisagreementSetIterator::DisagreementSetIterator(this,t1,t2,true);
    piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    *piVar1 = *piVar1 + 1;
    local_88 = local_d0._iter._first;
    local_80 = (DisagreementSetIterator *)local_d0._iter._it1._core;
    if ((DisagreementSetIterator *)local_d0._iter._it1._core != (DisagreementSetIterator *)0x0) {
      (local_d0._iter._it1._core)->_refCnt = (local_d0._iter._it1._core)->_refCnt + 1;
    }
    local_78 = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
               local_d0._iter._it2._iter._core;
    if (local_d0._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)local_d0._iter._it2._iter._core + 8) =
           *(int *)((long)local_d0._iter._it2._iter._core + 8) + 1;
    }
    piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    *piVar1 = *piVar1 + 1;
    local_70 = local_d0._iter._first;
    local_68 = (DisagreementSetIterator *)local_d0._iter._it1._core;
    if ((DisagreementSetIterator *)local_d0._iter._it1._core != (DisagreementSetIterator *)0x0) {
      (local_d0._iter._it1._core)->_refCnt = (local_d0._iter._it1._core)->_refCnt + 1;
    }
    local_60 = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
               local_d0._iter._it2._iter._core;
    if (local_d0._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)local_d0._iter._it2._iter._core + 8) =
           *(int *)((long)local_d0._iter._it2._iter._core + 8) + 1;
    }
    local_f8[0] = CONCAT31(local_f8[0]._1_3_,local_d0._iter._first);
    local_f0 = (DisagreementSetIterator *)local_d0._iter._it1._core;
    if ((DisagreementSetIterator *)local_d0._iter._it1._core != (DisagreementSetIterator *)0x0) {
      (local_d0._iter._it1._core)->_refCnt = (local_d0._iter._it1._core)->_refCnt + 1;
    }
    local_e8 = (DisagreementSetIterator *)local_d0._iter._it2._iter._core;
    if (local_d0._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)local_d0._iter._it2._iter._core + 8) =
           *(int *)((long)local_d0._iter._it2._iter._core + 8) + 1;
    }
    ::Lib::
    iterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>
              (&local_b8,(Lib *)local_f8,
               (IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                *)CONCAT71((int7)((ulong)extraout_RDX_02 >> 8),local_d0._iter._first));
    i_00 = extraout_RDX_03;
    if (local_e8 != (DisagreementSetIterator *)0x0) {
      piVar1 = (int *)((long)local_e8 + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_e8->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
          _vptr_IteratorCore[1])();
        i_00 = extraout_RDX_04;
      }
    }
    if (local_f0 != (DisagreementSetIterator *)0x0) {
      piVar1 = &(local_f0->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
                _refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_f0->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
          _vptr_IteratorCore[1])();
        i_00 = extraout_RDX_05;
      }
    }
    local_f8[0] = CONCAT31(local_f8[0]._1_3_,1);
    piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    *piVar1 = *piVar1 + 1;
    local_e8 = (DisagreementSetIterator *)CONCAT71(local_e8._1_7_,local_b8._iter._iter._first);
    local_e0 = local_b8._iter._iter._it1._core;
    if (local_b8._iter._iter._it1._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      (local_b8._iter._iter._it1._core)->_refCnt = (local_b8._iter._iter._it1._core)->_refCnt + 1;
    }
    local_d8 = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
               local_b8._iter._iter._it2._iter._core;
    if (local_b8._iter._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)local_b8._iter._iter._it2._iter._core + 8) =
           *(int *)((long)local_b8._iter._iter._it2._iter._core + 8) + 1;
    }
    local_f0 = this;
    ::Lib::
    iterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>>>
              (&local_58,(Lib *)local_f8,i_00);
    if (local_d8 != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &local_d8->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_d8->_vptr_IteratorCore[1])();
      }
    }
    if (local_e0 != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &local_e0->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_e0->_vptr_IteratorCore[1])();
      }
    }
    if (local_f0 != (DisagreementSetIterator *)0x0) {
      piVar1 = &(local_f0->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
                _refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_f0->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
          _vptr_IteratorCore[1])();
      }
    }
    if (local_b8._iter._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = (int *)((long)local_b8._iter._iter._it2._iter._core + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(*(_func_int ***)local_b8._iter._iter._it2._iter._core)[1])();
      }
    }
    if (local_b8._iter._iter._it1._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &(local_b8._iter._iter._it1._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_b8._iter._iter._it1._core)->_vptr_IteratorCore[1])();
      }
    }
    if (local_60 != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &local_60->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_60->_vptr_IteratorCore[1])();
      }
    }
    if (local_68 != (DisagreementSetIterator *)0x0) {
      piVar1 = &(local_68->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
                _refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_68->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
          _vptr_IteratorCore[1])();
      }
    }
    piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
        _vptr_IteratorCore[1])(this);
    }
    ::Lib::
    pvi<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>>>>
              ((Lib *)&local_100,&local_58);
  }
  else {
    local_a0 = local_d0._iter._first;
    local_98 = (DisagreementSetIterator *)local_d0._iter._it1._core;
    if ((DisagreementSetIterator *)local_d0._iter._it1._core != (DisagreementSetIterator *)0x0) {
      (local_d0._iter._it1._core)->_refCnt = (local_d0._iter._it1._core)->_refCnt + 1;
    }
    local_90 = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
               local_d0._iter._it2._iter._core;
    if (local_d0._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)local_d0._iter._it2._iter._core + 8) =
           *(int *)((long)local_d0._iter._it2._iter._core + 8) + 1;
    }
    local_100 = (long *)::Lib::FixedSizeAllocator<48UL>::alloc
                                  ((FixedSizeAllocator<48UL> *)
                                   (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    pDVar7 = local_98;
    if (local_98 != (DisagreementSetIterator *)0x0) {
      piVar1 = &(local_98->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
                _refCnt;
      *piVar1 = *piVar1 + 1;
    }
    if (local_90 != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      local_90->_refCnt = local_90->_refCnt + 1;
    }
    *(undefined4 *)(local_100 + 1) = 0;
    *local_100 = (long)&PTR__ProxyIterator_00b68e18;
    *(undefined1 *)(local_100 + 2) = local_a0;
    local_100[3] = (long)local_98;
    if (local_98 != (DisagreementSetIterator *)0x0) {
      piVar1 = &(local_98->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
                _refCnt;
      *piVar1 = *piVar1 + 1;
    }
    local_100[4] = (long)local_90;
    if (local_90 == (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)(local_100 + 1) = (int)local_100[1] + 1;
    }
    else {
      local_90->_refCnt = local_90->_refCnt + 1;
      *(int *)(local_100 + 1) = (int)local_100[1] + 1;
      piVar1 = &local_90->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_90->_vptr_IteratorCore[1])();
      }
    }
    if (pDVar7 != (DisagreementSetIterator *)0x0) {
      piVar1 = &(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt
      ;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(pDVar7->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
          _vptr_IteratorCore[1])(pDVar7);
      }
    }
  }
  if (bVar9) {
    if (local_58._iter._it2._iter._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = (int *)((long)local_58._iter._it2._iter._iter._it2._iter._core + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(*(_func_int ***)local_58._iter._it2._iter._iter._it2._iter._core)[1])();
      }
    }
    if (local_58._iter._it2._iter._iter._it1._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &(local_58._iter._it2._iter._iter._it1._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_58._iter._it2._iter._iter._it1._core)->_vptr_IteratorCore[1])();
      }
    }
    if (local_58._iter._it1._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &(local_58._iter._it1._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_58._iter._it1._core)->_vptr_IteratorCore[1])();
      }
    }
    if (local_78 != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &local_78->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_78->_vptr_IteratorCore[1])();
      }
    }
    if (local_80 != (DisagreementSetIterator *)0x0) {
      piVar1 = &(local_80->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
                _refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_80->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
          _vptr_IteratorCore[1])();
      }
    }
  }
  else {
    this = local_98;
    if (local_90 != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &local_90->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_90->_vptr_IteratorCore[1])();
        this = local_98;
      }
    }
  }
  if (this != (DisagreementSetIterator *)0x0) {
    piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
        _vptr_IteratorCore[1])(this);
    }
  }
  do {
    cVar4 = (**(code **)(*local_100 + 0x10))();
    if (cVar4 == '\0') {
      bVar9 = haveReversedVariantArgs::leftToRight._size ==
              haveReversedVariantArgs::rightToLeft._size;
      goto LAB_0056b286;
    }
    auVar10 = (**(code **)(*local_100 + 0x18))();
    bVar9 = false;
    if (((auVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       (bVar9 = false, (auVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0))
    goto LAB_0056b286;
    local_f8[0] = (uint)(auVar10._0_8_ >> 2);
    uVar8 = (uint)(auVar10._8_8_ >> 2);
    local_b8._iter._iter._0_4_ = uVar8;
    uVar6 = ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
            findOrInsert(&haveReversedVariantArgs::leftToRight,local_f8[0],(uint *)&local_b8);
    uVar3 = local_f8[0];
  } while ((uVar6 == uVar8) &&
          (uVar6 = ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
                   findOrInsert(&haveReversedVariantArgs::rightToLeft,local_b8._iter._iter._0_4_,
                                local_f8), uVar3 == uVar6));
  bVar9 = false;
LAB_0056b286:
  if (local_100 != (long *)0x0) {
    plVar2 = local_100 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    if ((int)*plVar2 == 0) {
      (**(code **)(*local_100 + 8))();
    }
  }
  if (local_d0._iter._it2._iter._core !=
      (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
    piVar1 = (int *)((long)local_d0._iter._it2._iter._core + 8);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(*(_func_int ***)local_d0._iter._it2._iter._core)[1])();
    }
  }
  if ((DisagreementSetIterator *)local_d0._iter._it1._core != (DisagreementSetIterator *)0x0) {
    piVar1 = &(local_d0._iter._it1._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*((IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
        &(local_d0._iter._it1._core)->_vptr_IteratorCore)->_vptr_IteratorCore[1])();
    }
  }
  return bVar9;
}

Assistant:

bool MatchingUtils::haveReversedVariantArgs(Term* l1, Term* l2)
{
  ASS_EQ(l1->arity(), 2);
  ASS_EQ(l2->arity(), 2);

  static DHMap<unsigned,unsigned,IdentityHash,DefaultHash> leftToRight;
  static DHMap<unsigned,unsigned,IdentityHash,DefaultHash> rightToLeft;
  leftToRight.reset();
  rightToLeft.reset();

  TermList s1, s2;
  bool sortUsed = false;
  if(l1->isLiteral() && static_cast<Literal*>(l1)->isTwoVarEquality())
  {
    if(l2->isLiteral() && static_cast<Literal*>(l2)->isTwoVarEquality()){
       s1 = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(l1));
       s2 = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(l2));
       sortUsed = true;
    } else {
      return false;
    }
  }

  auto it1 = concatIters(
      vi( new DisagreementSetIterator(*l1->nthArgument(0),*l2->nthArgument(1)) ),
      vi( new DisagreementSetIterator(*l1->nthArgument(1),*l2->nthArgument(0)) ));

  VirtualIterator<pair<TermList, TermList> > dsit =
  sortUsed ? pvi(concatIters(vi(new DisagreementSetIterator(s1,s2)), it1)) :
             pvi(it1);

  while(dsit.hasNext()) {
    pair<TermList,TermList> dp=dsit.next(); //disagreement pair
    if(!dp.first.isVar() || !dp.second.isVar()) {
  return false;
    }
    unsigned left=dp.first.var();
    unsigned right=dp.second.var();
    if(right!=leftToRight.findOrInsert(left,right)) {
  return false;
    }
    if(left!=rightToLeft.findOrInsert(right,left)) {
  return false;
    }
  }
  if(leftToRight.size()!=rightToLeft.size()) {
    return false;
  }

  return true;
}